

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parsePoint(Parser *this,QString *data,qsizetype offset)

{
  long from;
  storage_type_conflict *psVar1;
  Data *pDVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  qsizetype qVar10;
  QString *str;
  QString *str_00;
  QString *str_01;
  qsizetype in_R8;
  long in_FS_OFFSET;
  QStringView lhs;
  QStringView rhs;
  QString local_c0;
  QString local_a8;
  QString local_88;
  Point local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.name.d.d = (Data *)(data->d).ptr;
  local_68.name.d.ptr = (char16_t *)(data->d).size;
  uVar6 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x28,offset,CaseSensitive);
  local_68.name.d.d = (Data *)(data->d).ptr;
  local_68.name.d.ptr = (char16_t *)(data->d).size;
  uVar7 = QStringView::indexOf((QStringView *)&local_68,(QChar)0x2c,uVar6,CaseSensitive);
  local_68.parameters.d.ptr = (char16_t *)0x0;
  local_68.parameters.d.size = 0;
  local_68.name.d.size = 0;
  local_68.parameters.d.d = (Data *)0x0;
  local_68.name.d.d = (Data *)0x0;
  local_68.name.d.ptr = (char16_t *)0x0;
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::mid(&local_a8,data,uVar6 + 1,~uVar6 + uVar7);
  QString::simplified_helper(&local_88,&local_a8,str);
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  psVar1 = (storage_type_conflict *)(this->m_provider).d.size;
  if ((storage_type_conflict *)local_88.d.size == psVar1) {
    lhs.m_size = (qsizetype)(this->m_provider).d.ptr;
    lhs.m_data = (storage_type_conflict *)local_88.d.size;
    rhs.m_size = in_R8;
    rhs.m_data = psVar1;
    bVar5 = QtPrivate::equalStrings((QtPrivate *)local_88.d.ptr,lhs,rhs);
    if (bVar5) {
      from = uVar7 + 1;
      local_a8.d.d = (Data *)(data->d).ptr;
      local_a8.d.ptr = (char16_t *)(data->d).size;
      uVar8 = QStringView::indexOf((QStringView *)&local_a8,(QChar)0x2c,from,CaseSensitive);
      local_a8.d.d = (Data *)(data->d).ptr;
      local_a8.d.ptr = (char16_t *)(data->d).size;
      uVar9 = QStringView::indexOf((QStringView *)&local_a8,(QChar)0x29,from,CaseSensitive);
      uVar6 = uVar9;
      if ((long)uVar8 <= (long)uVar9 && uVar8 != 0xffffffffffffffff) {
        uVar6 = uVar8;
      }
      QString::mid(&local_c0,data,from,~uVar7 + uVar6);
      QString::simplified_helper(&local_a8,&local_c0,str_00);
      pcVar4 = local_68.name.d.ptr;
      pDVar3 = local_68.name.d.d;
      qVar10 = local_a8.d.size;
      pDVar2 = local_a8.d.d;
      local_a8.d.d = local_68.name.d.d;
      local_68.name.d.d = pDVar2;
      local_68.name.d.ptr = local_a8.d.ptr;
      local_a8.d.ptr = pcVar4;
      local_a8.d.size = local_68.name.d.size;
      local_68.name.d.size = qVar10;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
      if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((long)uVar8 <= (long)uVar9 && uVar8 != 0xffffffffffffffff) {
        local_a8.d.d = (Data *)(data->d).ptr;
        local_a8.d.ptr = (char16_t *)(data->d).size;
        qVar10 = QStringView::indexOf((QStringView *)&local_a8,(QChar)0x29,uVar6,CaseSensitive);
        QString::mid(&local_c0,data,uVar6 + 1,~uVar6 + (long)(int)qVar10);
        QString::simplified_helper(&local_a8,&local_c0,str_01);
        pcVar4 = local_68.parameters.d.ptr;
        pDVar3 = local_68.parameters.d.d;
        qVar10 = local_a8.d.size;
        pDVar2 = local_a8.d.d;
        local_a8.d.d = local_68.parameters.d.d;
        local_68.parameters.d.d = pDVar2;
        local_68.parameters.d.ptr = local_a8.d.ptr;
        local_a8.d.ptr = pcVar4;
        local_a8.d.size = local_68.parameters.d.size;
        local_68.parameters.d.size = qVar10;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        if (&(local_c0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QtPrivate::QGenericArrayOps<Point>::emplace<Point_const&>
                ((QGenericArrayOps<Point> *)&this->m_points,(this->m_points).d.size,&local_68);
      QList<Point>::end(&this->m_points);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.parameters.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.parameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.parameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.parameters.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.parameters.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parsePoint(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    Point point;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(','), endOfProvider + 1);
    qsizetype endOfPoint2 = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    bool params = true;
    if (endOfPoint == -1 || endOfPoint2 < endOfPoint) {
        endOfPoint = endOfPoint2;
        params = false;
    }
    point.name = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();
    if (params) {
        int endOfParams = data.indexOf(QLatin1Char(')'), endOfPoint);
        point.parameters = data.mid(endOfPoint + 1, endOfParams - endOfPoint - 1).simplified();
    }

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(point.name), qPrintable(point.parameters)));

    m_points.push_back(point);
}